

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperLib.c
# Opt level: O0

Map_SuperLib_t *
Map_SuperLibCreate(Mio_Library_t *pGenlib,Vec_Str_t *vStr,char *pFileName,char *pExcludeFile,
                  int fAlgorithm,int fVerbose)

{
  float *pfVar1;
  int iVar2;
  Map_SuperLib_t *pLib;
  char *pcVar3;
  Extra_MmFixed_t *pEVar4;
  Extra_MmFlex_t *pEVar5;
  Map_HashTable_t *pMVar6;
  abctime aVar7;
  abctime aVar8;
  Mio_Gate_t *pMVar9;
  Map_Super_t *pMVar10;
  float fVar11;
  float local_50;
  int Status;
  abctime clk;
  Map_SuperLib_t *p;
  int fVerbose_local;
  int fAlgorithm_local;
  char *pExcludeFile_local;
  char *pFileName_local;
  Vec_Str_t *vStr_local;
  Mio_Library_t *pGenlib_local;
  
  pLib = (Map_SuperLib_t *)malloc(0xb8);
  memset(pLib,0,0xb8);
  pcVar3 = Abc_UtilStrsav(pFileName);
  pLib->pName = pcVar3;
  pLib->fVerbose = fVerbose;
  pEVar4 = Extra_MmFixedStart(0x100);
  pLib->mmSupers = pEVar4;
  pEVar4 = Extra_MmFixedStart(0x20);
  pLib->mmEntries = pEVar4;
  pEVar5 = Extra_MmFlexStart();
  pLib->mmForms = pEVar5;
  Map_MappingSetupTruthTables(pLib->uTruths);
  pMVar6 = Map_SuperTableCreate(pLib);
  pLib->tTableC = pMVar6;
  pMVar6 = Map_SuperTableCreate(pLib);
  pLib->tTable = pMVar6;
  aVar7 = Abc_Clock();
  if (vStr == (Vec_Str_t *)0x0) {
    if (fAlgorithm == 0) {
      if (pExcludeFile != (char *)0x0) {
        Map_SuperLibFree(pLib);
        printf("Error: Exclude file support not present for old format. Stop.\n");
        return (Map_SuperLib_t *)0x0;
      }
      iVar2 = Map_LibraryRead(pLib,pFileName);
      if (iVar2 == 0) {
        Map_SuperLibFree(pLib);
        return (Map_SuperLib_t *)0x0;
      }
    }
    else {
      iVar2 = Map_LibraryReadTree(pLib,pGenlib,pFileName,pExcludeFile);
      if (iVar2 == 0) {
        Map_SuperLibFree(pLib);
        return (Map_SuperLib_t *)0x0;
      }
    }
  }
  else {
    iVar2 = Map_LibraryReadFileTreeStr(pLib,pGenlib,vStr,pFileName);
    if (iVar2 == 0) {
      Map_SuperLibFree(pLib);
      return (Map_SuperLib_t *)0x0;
    }
    iVar2 = Map_LibraryDeriveGateInfo(pLib,(st__table *)0x0);
    if (iVar2 == 0) {
      Map_SuperLibFree(pLib);
      return (Map_SuperLib_t *)0x0;
    }
    if (pLib->nVarsMax < 1) {
      __assert_fail("p->nVarsMax > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperLib.c"
                    ,0x5f,
                    "Map_SuperLib_t *Map_SuperLibCreate(Mio_Library_t *, Vec_Str_t *, char *, char *, int, int)"
                   );
    }
  }
  if (0 < pLib->nVarsMax) {
    if (fVerbose != 0) {
      printf("Loaded %d unique %d-input supergates from \"%s\".  ",(ulong)(uint)pLib->nSupersReal,
             (ulong)(uint)pLib->nVarsMax,pFileName);
      Abc_Print(1,"%s =","Time");
      aVar8 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar7) * 1.0) / 1000000.0);
    }
    pMVar9 = Mio_LibraryReadInv(pLib->pGenlib);
    pLib->pGateInv = pMVar9;
    fVar11 = Mio_LibraryReadDelayInvRise(pLib->pGenlib);
    (pLib->tDelayInv).Rise = fVar11;
    fVar11 = Mio_LibraryReadDelayInvFall(pLib->pGenlib);
    (pLib->tDelayInv).Fall = fVar11;
    fVar11 = (pLib->tDelayInv).Rise;
    pfVar1 = &(pLib->tDelayInv).Fall;
    if (fVar11 < *pfVar1 || fVar11 == *pfVar1) {
      local_50 = (pLib->tDelayInv).Fall;
    }
    else {
      local_50 = (pLib->tDelayInv).Rise;
    }
    (pLib->tDelayInv).Worst = local_50;
    fVar11 = Mio_LibraryReadAreaInv(pLib->pGenlib);
    pLib->AreaInv = fVar11;
    fVar11 = Mio_LibraryReadAreaBuf(pLib->pGenlib);
    pLib->AreaBuf = fVar11;
    pMVar10 = (Map_Super_t *)Extra_MmFixedEntryFetch(pLib->mmSupers);
    pLib->pSuperInv = pMVar10;
    memset(pLib->pSuperInv,0,0x100);
    pLib->pSuperInv->Num = -1;
    *(uint *)&pLib->pSuperInv->field_0x4 = *(uint *)&pLib->pSuperInv->field_0x4 & 0xffffff1f | 0x20;
    *(uint *)&pLib->pSuperInv->field_0x4 = *(uint *)&pLib->pSuperInv->field_0x4 & 0xffffffe3 | 4;
    *(uint *)&pLib->pSuperInv->field_0x4 = *(uint *)&pLib->pSuperInv->field_0x4 & 0xfffff0ff | 0xa00
    ;
    pLib->pSuperInv->pFanins[0] = *pLib->ppSupers;
    pLib->pSuperInv->pRoot = pLib->pGateInv;
    pLib->pSuperInv->Area = pLib->AreaInv;
    pMVar10 = pLib->pSuperInv;
    fVar11 = (pLib->tDelayInv).Fall;
    (pMVar10->tDelayMax).Rise = (pLib->tDelayInv).Rise;
    (pMVar10->tDelayMax).Fall = fVar11;
    (pMVar10->tDelayMax).Worst = (pLib->tDelayInv).Worst;
    pLib->pSuperInv->tDelaysR[0].Rise = -9999.0;
    pLib->pSuperInv->tDelaysR[0].Fall = (pLib->tDelayInv).Rise;
    pLib->pSuperInv->tDelaysF[0].Rise = (pLib->tDelayInv).Fall;
    pLib->pSuperInv->tDelaysF[0].Fall = -9999.0;
    return pLib;
  }
  __assert_fail("p->nVarsMax > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperLib.c"
                ,0x77,
                "Map_SuperLib_t *Map_SuperLibCreate(Mio_Library_t *, Vec_Str_t *, char *, char *, int, int)"
               );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads in the supergate library and prepares it for use.]

  Description [The supergates library comes in a .super file. This file
  contains descriptions of supergates along with some relevant information.
  This procedure reads the supergate file, canonicizes the supergates,
  and constructs an additional lookup table, which can be used to map
  truth tables of the cuts into the pair (phase, supergate). The phase
  indicates how the current truth table should be phase assigned to 
  match the canonical form of the supergate. The resulting phase is the
  bitwise EXOR of the phase needed to canonicize the supergate and the
  phase needed to transform the truth table into its canonical form.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Map_SuperLib_t * Map_SuperLibCreate( Mio_Library_t * pGenlib, Vec_Str_t * vStr, char * pFileName, char * pExcludeFile, int fAlgorithm, int fVerbose )
{
    Map_SuperLib_t * p;
    abctime clk;

    // start the supergate library
    p = ABC_ALLOC( Map_SuperLib_t, 1 );
    memset( p, 0, sizeof(Map_SuperLib_t) );
    p->pName     = Abc_UtilStrsav(pFileName);
    p->fVerbose  = fVerbose;
    p->mmSupers  = Extra_MmFixedStart( sizeof(Map_Super_t) );
    p->mmEntries = Extra_MmFixedStart( sizeof(Map_HashEntry_t) );
    p->mmForms   = Extra_MmFlexStart();
    Map_MappingSetupTruthTables( p->uTruths );

    // start the hash table
    p->tTableC = Map_SuperTableCreate( p );
    p->tTable  = Map_SuperTableCreate( p );

    // read the supergate library from file
clk = Abc_Clock();
    if ( vStr != NULL )
    {
        // read the supergate library from file
        int Status = Map_LibraryReadFileTreeStr( p, pGenlib, vStr, pFileName );
        if ( Status == 0 )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
        // prepare the info about the library
        Status = Map_LibraryDeriveGateInfo( p, NULL );
        if ( Status == 0 )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
        assert( p->nVarsMax > 0 );
    }
    else if ( fAlgorithm )
    {
        if ( !Map_LibraryReadTree( p, pGenlib, pFileName, pExcludeFile ) )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
    }
    else
    {
        if ( pExcludeFile != 0 )
        {
            Map_SuperLibFree( p );
            printf ("Error: Exclude file support not present for old format. Stop.\n");
            return NULL;
        }
        if ( !Map_LibraryRead( p, pFileName ) )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
    }
    assert( p->nVarsMax > 0 );

    // report the stats
    if ( fVerbose ) 
    {
        printf( "Loaded %d unique %d-input supergates from \"%s\".  ", 
            p->nSupersReal, p->nVarsMax, pFileName );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // assign the interver parameters
    p->pGateInv        = Mio_LibraryReadInv( p->pGenlib );
    p->tDelayInv.Rise  = Mio_LibraryReadDelayInvRise( p->pGenlib );
    p->tDelayInv.Fall  = Mio_LibraryReadDelayInvFall( p->pGenlib );
    p->tDelayInv.Worst = MAP_MAX( p->tDelayInv.Rise, p->tDelayInv.Fall );
    p->AreaInv         = Mio_LibraryReadAreaInv( p->pGenlib );
    p->AreaBuf         = Mio_LibraryReadAreaBuf( p->pGenlib );

    // assign the interver supergate
    p->pSuperInv = (Map_Super_t *)Extra_MmFixedEntryFetch( p->mmSupers );
    memset( p->pSuperInv, 0, sizeof(Map_Super_t) );
    p->pSuperInv->Num         = -1;
    p->pSuperInv->nGates      =  1;
    p->pSuperInv->nFanins     =  1;
    p->pSuperInv->nFanLimit   = 10;
    p->pSuperInv->pFanins[0]  = p->ppSupers[0];
    p->pSuperInv->pRoot       = p->pGateInv;
    p->pSuperInv->Area        = p->AreaInv;
    p->pSuperInv->tDelayMax   = p->tDelayInv;
    p->pSuperInv->tDelaysR[0].Rise = MAP_NO_VAR;
    p->pSuperInv->tDelaysR[0].Fall = p->tDelayInv.Rise;
    p->pSuperInv->tDelaysF[0].Rise = p->tDelayInv.Fall;
    p->pSuperInv->tDelaysF[0].Fall = MAP_NO_VAR;
    return p;
}